

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeEvaluationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double extraout_XMM0_Qa;
  double __val;
  double __val_00;
  double __val_01;
  double extraout_XMM0_Qa_00;
  double __val_02;
  double __val_03;
  double __val_04;
  Variable x;
  Variable y;
  Variable local_188;
  Expression local_170;
  Expression local_158;
  Variable local_140;
  string local_128;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Kandinsky::Variable::Variable(&local_188);
  Kandinsky::Variable::Variable(&local_140);
  (local_188.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_140.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       2.0;
  Kandinsky::operator+<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_170,&local_188,&local_140);
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Expression,_nullptr>
            (&local_158,&local_188,&local_170);
  (**(local_158.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_188.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_e8,__val);
  std::operator+(&local_c8,&local_e8," * (");
  (**((local_188.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_108,__val_00);
  std::operator+(&local_a8,&local_c8,&local_108);
  std::operator+(&local_88,&local_a8," + ");
  (**((local_140.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_128,__val_01);
  std::operator+(&local_68,&local_88,&local_128);
  std::operator+(&local_28,&local_68,") != 15");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa == 15.0) & 1),&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  Kandinsky::Expression::~Expression(&local_158);
  Kandinsky::Expression::~Expression(&local_170);
  Kandinsky::operator*<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_170,&local_188,&local_188);
  Kandinsky::operator+<Kandinsky::Expression,_Kandinsky::Variable,_nullptr>
            (&local_158,&local_170,&local_140);
  (**(local_158.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_188.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_e8,__val_02);
  std::operator+(&local_c8,&local_e8," * ");
  (**((local_188.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_108,__val_03);
  std::operator+(&local_a8,&local_c8,&local_108);
  std::operator+(&local_88,&local_a8," + ");
  (**((local_140.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_128,__val_04);
  std::operator+(&local_68,&local_88,&local_128);
  std::operator+(&local_48,&local_68," != 11");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_00 == 11.0) & 1),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  Kandinsky::Expression::~Expression(&local_158);
  Kandinsky::Expression::~Expression(&local_170);
  Kandinsky::Variable::~Variable(&local_140);
  Kandinsky::Variable::~Variable(&local_188);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((x * (x + y)).evaluate() == 15, std::to_string(x.evaluate()) + " * (" + std::to_string(x.evaluate()) + " + " + std::to_string(y.evaluate()) + ") != 15");
    assertOrExit((x * x + y).evaluate() == 11, std::to_string(x.evaluate()) + " * " + std::to_string(x.evaluate()) + " + " + std::to_string(y.evaluate()) + " != 11");

    return 0;
}